

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
::alloc(array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
        *this,int new_len)

{
  uint uVar1;
  int iVar2;
  CServerFilter *pCVar3;
  long lVar4;
  
  this->list_size = new_len;
  pCVar3 = allocator_default<CServerBrowserFilter::CServerFilter>::alloc_array(new_len);
  uVar1 = this->list_size;
  if (this->num_elements < this->list_size) {
    uVar1 = this->num_elements;
  }
  if (0 < (int)uVar1) {
    lVar4 = 0;
    do {
      CServerBrowserFilter::CServerFilter::operator=
                ((CServerFilter *)((long)((pCVar3->m_FilterInfo).m_aGametype + -2) + 8 + lVar4),
                 (CServerFilter *)((long)((this->list->m_FilterInfo).m_aGametype + -2) + 8 + lVar4))
      ;
      lVar4 = lVar4 + 0xe8;
    } while ((ulong)uVar1 * 0xe8 - lVar4 != 0);
  }
  allocator_default<CServerBrowserFilter::CServerFilter>::free_array(this->list);
  iVar2 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar2 = this->num_elements;
  }
  this->num_elements = iVar2;
  this->list = pCVar3;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}